

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

void __thiscall
cs::domain_manager::involve_domain(domain_manager *this,domain_type *domain,bool is_override)

{
  bool bVar1;
  domain_type *in_RDI;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  domain_type *__range2;
  bool in_stack_0000009f;
  var *in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a8;
  domain_manager *in_stack_000000b0;
  reference in_stack_ffffffffffffffa8;
  
  domain_type::begin_abi_cxx11_((domain_type *)0x1ccd74);
  domain_type::end_abi_cxx11_((domain_type *)0x1ccd88);
  while( true ) {
    bVar1 = phmap::priv::operator!=
                      ((const_iterator *)in_RDI,(const_iterator *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    in_stack_ffffffffffffffa8 =
         phmap::priv::
         raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::const_iterator::operator*((const_iterator *)0x1ccdb1);
    domain_type::get_var_by_id(in_RDI,(size_t)in_stack_ffffffffffffffa8);
    add_var<std::__cxx11::string_const&>
              (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009f);
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::const_iterator::operator++((const_iterator *)in_RDI);
  }
  return;
}

Assistant:

void involve_domain(const domain_type &domain, bool is_override = false)
		{
			for (auto &it: domain)
				add_var(it.first, domain.get_var_by_id(it.second), is_override);
		}